

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O3

void __thiscall HRSS_Poly3Invert_Test::TestBody(HRSS_Poly3Invert_Test *this)

{
  char *pcVar1;
  long lVar2;
  ScopedTrace gtest_trace_54;
  poly3 r;
  poly3 result;
  poly3 inverse;
  ScopedTrace local_329;
  undefined1 local_328 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  Bytes local_318;
  unsigned_long local_308;
  Bytes local_300;
  undefined1 local_2f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  ulong local_2a0;
  long alStack_298 [10];
  ulong local_248;
  poly3 local_240;
  poly3 local_190;
  poly3 local_e0;
  
  memset(local_240.s.v + 1,0,0xa8);
  memset(&local_e0,0,0xb0);
  memset(&local_190,0,0xb0);
  local_240.s.v[0] = 0;
  local_240.a.v[0] = 1;
  local_308 = 0;
  do {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_329,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x36,&local_308);
    memset((poly3 *)local_2f0,0,0xb0);
    alStack_298[local_308 >> 6] = 1L << ((byte)local_308 & 0x3f);
    HRSS_poly3_invert(&local_e0,(poly3 *)local_2f0);
    HRSS_poly3_mul(&local_190,&local_e0,(poly3 *)local_2f0);
    local_318.span_.data_ = (uchar *)&local_240;
    local_318.span_.size_ = 0xb0;
    local_300.span_.size_ = 0xb0;
    local_300.span_.data_ = (uchar *)&local_190;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_328,"Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p))",
               "Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result))",&local_318,
               &local_300);
    if (local_328[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_318);
      pcVar1 = "";
      if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = (local_320->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x3f,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
      if ((poly3 *)local_318.span_.data_ != (poly3 *)0x0) {
        (**(code **)(((poly2 *)local_318.span_.data_)->v[0] + 8))();
      }
    }
    if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_320,local_320);
    }
    testing::ScopedTrace::~ScopedTrace(&local_329);
    local_308 = local_308 + 1;
  } while (local_308 < 700);
  local_240.s.v[0] = 1;
  local_240.a.v[0] = 1;
  HRSS_poly3_invert(&local_e0,&local_240);
  local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb0;
  local_318.span_.size_ = 0xb0;
  local_328 = (undefined1  [8])&local_240;
  local_318.span_.data_ = (uchar *)&local_e0;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_2f0,"Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p))",
             "Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse))",(Bytes *)local_328
             ,&local_318);
  if (local_2f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_328);
    if (local_2e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_2e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x47,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if (local_328 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_328 + 8))();
    }
  }
  if (local_2e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2e8,local_2e8);
  }
  local_240.s.v[0] = 0;
  local_240.a.v[0] = 1;
  HRSS_poly3_invert(&local_e0,&local_240);
  local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_000000b0;
  local_318.span_.size_ = 0xb0;
  local_328 = (undefined1  [8])&local_240;
  local_318.span_.data_ = (uchar *)&local_e0;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_2f0,"Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p))",
             "Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse))",(Bytes *)local_328
             ,&local_318);
  if (local_2f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_328);
    if (local_2e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_2e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x4e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if (local_328 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_328 + 8))();
    }
  }
  if (local_2e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2e8,local_2e8);
  }
  lVar2 = 500;
  do {
    poly3_rand((poly3 *)local_2f0);
    local_2a0 = local_2a0 & 0xfffffffffffffff;
    local_248 = local_248 & 0xfffffffffffffff;
    HRSS_poly3_invert(&local_e0,(poly3 *)local_2f0);
    HRSS_poly3_mul(&local_190,&local_e0,(poly3 *)local_2f0);
    local_318.span_.data_ = (uchar *)&local_240;
    local_318.span_.size_ = 0xb0;
    local_300.span_.size_ = 0xb0;
    local_300.span_.data_ = (uchar *)&local_190;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_328,"Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p))",
               "Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result))",&local_318,
               &local_300);
    if (local_328[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_318);
      pcVar1 = "";
      if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = (local_320->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x5c,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
      if ((poly3 *)local_318.span_.data_ != (poly3 *)0x0) {
        (**(code **)(((poly2 *)local_318.span_.data_)->v[0] + 8))();
      }
    }
    if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_320,local_320);
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

TEST(HRSS, Poly3Invert) {
  poly3 p, inverse, result;
  memset(&p, 0, sizeof(p));
  memset(&inverse, 0, sizeof(inverse));
  memset(&result, 0, sizeof(result));

  p.s.v[0] = 0;
  p.a.v[0] = 1;
  for (size_t i = 0; i < N - 1; i++) {
    SCOPED_TRACE(i);
    poly3 r;
    OPENSSL_memset(&r, 0, sizeof(r));
    r.a.v[i / BITS_PER_WORD] = (UINT64_C(1) << (i % BITS_PER_WORD));
    HRSS_poly3_invert(&inverse, &r);
    HRSS_poly3_mul(&result, &inverse, &r);
    // r×r⁻¹ = 1, and |p| contains 1.
    EXPECT_EQ(
        Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p)),
        Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result)));
  }

  // The inverse of -1 is -1.
  p.s.v[0] = 1;
  p.a.v[0] = 1;
  HRSS_poly3_invert(&inverse, &p);
  EXPECT_EQ(Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p)),
            Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse)));

  // The inverse of 1 is 1.
  p.s.v[0] = 0;
  p.a.v[0] = 1;
  HRSS_poly3_invert(&inverse, &p);
  EXPECT_EQ(Bytes(reinterpret_cast<const uint8_t*>(&p), sizeof(p)),
            Bytes(reinterpret_cast<const uint8_t*>(&inverse), sizeof(inverse)));

  for (size_t i = 0; i < 500; i++) {
    poly3 r;
    poly3_rand(&r);
    // Drop the term at x^700 because |HRSS_poly3_invert| only handles reduced
    // inputs.
    r.s.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
    r.a.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
    HRSS_poly3_invert(&inverse, &r);
    HRSS_poly3_mul(&result, &inverse, &r);
    // r×r⁻¹ = 1, and |p| contains 1.
    EXPECT_EQ(
        Bytes(reinterpret_cast<const uint8_t *>(&p), sizeof(p)),
        Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result)));
  }
}